

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O3

void __thiscall
Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::copy_from
          (Simplex_tree<Gudhi::Simplex_tree_options_default> *this,
          Simplex_tree<Gudhi::Simplex_tree_options_default> *complex_source)

{
  Dictionary *pDVar1;
  pointer pvVar2;
  stored_size_type sVar3;
  bool bVar4;
  pointer bg;
  pointer ppVar5;
  pointer ppVar6;
  Siblings root_source;
  Data local_88;
  pointer local_68;
  undefined1 local_60 [16];
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *local_50;
  stored_size_type local_48;
  stored_size_type local_40;
  pointer local_38;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *local_30;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
  local_28;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_false>
  local_20;
  
  this->null_vertex_ = complex_source->null_vertex_;
  pvVar2 = (this->filtration_vect_).
           super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->filtration_vect_).
      super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pvVar2) {
    (this->filtration_vect_).
    super__Vector_base<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pvVar2;
  }
  this->dimension_ = complex_source->dimension_;
  local_60._8_4_ = (complex_source->root_).parent_;
  local_60._0_8_ = (complex_source->root_).oncles_;
  pDVar1 = &(complex_source->root_).members_;
  boost::container::
  vector_alloc_holder<boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>,unsigned_long,boost::move_detail::integral_constant<unsigned_int,1u>>
  ::
  vector_alloc_holder<boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>const&>
            ((vector_alloc_holder<boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>,unsigned_long,boost::move_detail::integral_constant<unsigned_int,1u>>
              *)&local_50,pDVar1,
             (complex_source->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size);
  sVar3 = (complex_source->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
  if (sVar3 != 0) {
    memmove(local_50,(pDVar1->m_flat_tree).m_data.m_seq.m_holder.m_start,sVar3 << 5);
  }
  local_30 = local_50 + local_48;
  local_88.m_seq.m_holder.m_start = (pointer)0x0;
  local_88.m_seq.m_holder.m_size = 0;
  local_88.m_seq.m_holder.m_capacity = 0;
  local_20.m_ptr =
       (pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
        *)0x0;
  local_28.m_ptr = local_50;
  boost::container::
  vector<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>,void>
  ::
  insert<boost::container::vec_iterator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,false>>
            ((vector<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,boost::container::new_allocator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>,void>
              *)&local_68,(const_iterator *)&local_88,&local_20,&local_28,&local_30);
  local_68 = local_88.m_seq.m_holder.m_start;
  local_38 = local_88.m_seq.m_holder.m_start + local_88.m_seq.m_holder.m_size;
  bVar4 = boost::container::dtl::
          is_sorted<boost::container::vec_iterator<boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>*,true>,boost::container::dtl::flat_tree_value_compare<std::less<int>,boost::container::dtl::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,boost::container::dtl::select1st<int>>>
                    ();
  if (bVar4) {
    boost::container::dtl::
    flat_tree<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_boost::container::dtl::select1st<int>,_std::less<int>,_boost::container::new_allocator<boost::container::dtl::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
    ::Data::operator=((Data *)&(this->root_).members_,&local_88);
    if (local_88.m_seq.m_holder.m_capacity != 0) {
      operator_delete(local_88.m_seq.m_holder.m_start);
    }
    sVar3 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_size;
    if (sVar3 != 0) {
      ppVar6 = (this->root_).members_.m_flat_tree.m_data.m_seq.m_holder.m_start;
      ppVar5 = ppVar6 + sVar3;
      do {
        if (ppVar6 == (pointer)0x0) {
          __assert_fail("!!m_ptr","/usr/include/boost/container/vector.hpp",0x8e,
                        "reference boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>> *, false>::operator*() const [Pointer = std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>> *, IsConst = false]"
                       );
        }
        (ppVar6->second).children_ = &this->root_;
        ppVar6 = ppVar6 + 1;
      } while (ppVar6 != ppVar5);
    }
    rec_copy<true,true,Gudhi::Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,boost::container::flat_map<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>,std::less<int>,void>>,Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::copy_from(Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>const&)::_lambda(double_const&)_1_>
              (this,&this->root_,
               (Simplex_tree_siblings<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>,_boost::container::flat_map<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>,_std::less<int>,_void>_>
                *)local_60,(anon_class_1_0_00000001 *)&local_88);
    if (local_40 != 0) {
      operator_delete(local_50);
    }
    return;
  }
  __assert_fail("(is_sorted)(this->m_data.m_seq.cbegin(), this->m_data.m_seq.cend(), this->priv_value_comp())"
                ,"/usr/include/boost/container/detail/flat_tree.hpp",0x265,
                "boost::container::dtl::flat_tree<boost::container::dtl::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>>, boost::container::dtl::select1st<int>, std::less<int>, boost::container::new_allocator<boost::container::dtl::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>>>>::flat_tree(ordered_range_t, InputIterator, InputIterator) [Value = boost::container::dtl::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>>, KeyOfValue = boost::container::dtl::select1st<int>, Compare = std::less<int>, AllocatorOrContainer = boost::container::new_allocator<boost::container::dtl::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>>>, InputIterator = boost::container::vec_iterator<std::pair<int, Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<>>> *, false>]"
               );
}

Assistant:

void copy_from(const Simplex_tree& complex_source) {
    null_vertex_ = complex_source.null_vertex_;
    filtration_vect_.clear();
    dimension_ = complex_source.dimension_;
    auto root_source = complex_source.root_;

    // root members copy
    root_.members() =
        Dictionary(boost::container::ordered_unique_range, root_source.members().begin(), root_source.members().end());
    // Needs to reassign children
    for (auto& map_el : root_.members()) {
      map_el.second.assign_children(&root_);
    }
    // Specific for optional data
    if constexpr (!std::is_same_v<Simplex_data, No_simplex_data>) {
      auto dst_iter = root_.members().begin();
      auto src_iter = root_source.members().begin();

      while(dst_iter != root_.members().end() || src_iter != root_source.members().end()) {
        dst_iter->second.data() = src_iter->second.data();
        dst_iter++;
        src_iter++;
      }
      // Check in debug mode members data were copied
      assert(dst_iter == root_.members().end());
      assert(src_iter == root_source.members().end());
    }
    rec_copy<Options::store_key, true>(
        &root_, &root_source, [](const Filtration_value& fil) -> const Filtration_value& { return fil; });
  }